

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

mFILE * mfcreate(char *data,int size)

{
  mFILE *pmVar1;
  
  pmVar1 = (mFILE *)malloc(0x38);
  if (pmVar1 != (mFILE *)0x0) {
    pmVar1->fp = (FILE *)0x0;
    pmVar1->data = data;
    pmVar1->alloced = (long)size;
    pmVar1->size = (long)size;
    pmVar1->eof = 0;
    pmVar1->mode = 3;
    pmVar1->offset = 0;
    pmVar1->flush_pos = 0;
  }
  return pmVar1;
}

Assistant:

mFILE *mfcreate(char *data, int size) {
    mFILE *mf = (mFILE *)malloc(sizeof(*mf));
    if (NULL == mf) return NULL;
    mf->fp = NULL;
    mf->data = data;
    mf->alloced = size;
    mf->size = size;
    mf->eof = 0;
    mf->offset = 0;
    mf->flush_pos = 0;
    mf->mode = MF_READ | MF_WRITE;
    return mf;
}